

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_conserve.cpp
# Opt level: O0

void Omega_h::introduce_class_integ_error
               (Mesh *old_mesh,Mesh *new_mesh,Cavs *class_cavs,Reals *old_elem_densities,
               Reals *new_elem_densities,Write<double> *new_elem_errors_w)

{
  LO b;
  Write<double> local_458;
  Read<int> local_448;
  Read<double> local_438;
  allocator local_421;
  string local_420 [32];
  Read<double> local_400;
  Read<double> local_3f0;
  Write<double> local_3e0;
  undefined1 local_3d0 [8];
  Reals cav_elem_errors;
  Read<double> local_3b0;
  undefined1 local_3a0 [8];
  Read<double> cav_elem_error_densities;
  Read<double> local_380;
  undefined1 local_370 [8];
  Reals cav_error_densities;
  Read<int> local_350;
  undefined1 local_340 [8];
  Read<double> new_cav_sizes;
  Read<double> local_320;
  undefined1 local_310 [8];
  Read<double> cav_errors;
  Read<int> local_2f0;
  undefined1 local_2e0 [8];
  Read<double> new_cav_integrals;
  Read<int> local_2c0;
  undefined1 local_2b0 [8];
  Read<double> old_cav_integrals;
  string local_298 [32];
  Read<double> local_278;
  Read<double> local_268;
  Write<double> local_258;
  undefined1 local_248 [8];
  Reals new_cav_elem_integrals;
  string local_230 [32];
  Read<double> local_210;
  Read<double> local_200;
  Write<double> local_1f0;
  undefined1 local_1e0 [8];
  Reals old_cav_elem_integrals;
  Read<int> local_1c0;
  Write<signed_char> local_1b0;
  undefined1 local_1a0 [8];
  Read<double> new_cav_elem_sizes;
  Read<int> local_180;
  Write<signed_char> local_170;
  undefined1 local_160 [8];
  Read<double> old_cav_elem_sizes;
  Read<int> local_140;
  Write<signed_char> local_130;
  undefined1 local_120 [8];
  Read<double> new_cav_elem_densities;
  Read<int> local_100;
  Write<signed_char> local_f0;
  undefined1 local_e0 [8];
  Read<double> old_cav_elem_densities;
  Reals new_elem_sizes;
  Reals old_elem_sizes;
  undefined1 local_a0 [8];
  Graph keys2old_elems;
  Graph keys2new_elems;
  int ncomps;
  Write<double> *new_elem_errors_w_local;
  Reals *new_elem_densities_local;
  Reals *old_elem_densities_local;
  Cavs *class_cavs_local;
  Mesh *new_mesh_local;
  Mesh *old_mesh_local;
  ulong local_10;
  
  if (((ulong)(old_elem_densities->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = ((old_elem_densities->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (ulong)(old_elem_densities->write_).shared_alloc_.alloc >> 3;
  }
  b = Mesh::nelems(old_mesh);
  keys2new_elems.ab2b.write_.shared_alloc_.direct_ptr._4_4_ =
       divide_no_remainder<int>((int)(local_10 >> 3),b);
  Graph::Graph((Graph *)&keys2old_elems.ab2b.write_.shared_alloc_.direct_ptr,
               &class_cavs->keys2new_elems);
  Graph::Graph((Graph *)local_a0,&class_cavs->keys2old_elems);
  Mesh::ask_sizes((Mesh *)&new_elem_sizes.write_.shared_alloc_.direct_ptr);
  Mesh::ask_sizes((Mesh *)&old_cav_elem_densities.write_.shared_alloc_.direct_ptr);
  Read<int>::Read(&local_100,(Read<int> *)&keys2old_elems.a2ab.write_.shared_alloc_.direct_ptr);
  Read<double>::Read((Read<double> *)&new_cav_elem_densities.write_.shared_alloc_.direct_ptr,
                     old_elem_densities);
  unmap<double>((Omega_h *)&local_f0,&local_100,
                (Read<signed_char> *)&new_cav_elem_densities.write_.shared_alloc_.direct_ptr,
                keys2new_elems.ab2b.write_.shared_alloc_.direct_ptr._4_4_);
  read<double>((Omega_h *)local_e0,&local_f0);
  Write<double>::~Write((Write<double> *)&local_f0);
  Read<double>::~Read((Read<double> *)&new_cav_elem_densities.write_.shared_alloc_.direct_ptr);
  Read<int>::~Read(&local_100);
  Read<int>::Read(&local_140,(Read<int> *)&keys2new_elems.a2ab.write_.shared_alloc_.direct_ptr);
  Read<double>::Read((Read<double> *)&old_cav_elem_sizes.write_.shared_alloc_.direct_ptr,
                     new_elem_densities);
  unmap<double>((Omega_h *)&local_130,&local_140,
                (Read<signed_char> *)&old_cav_elem_sizes.write_.shared_alloc_.direct_ptr,
                keys2new_elems.ab2b.write_.shared_alloc_.direct_ptr._4_4_);
  read<double>((Omega_h *)local_120,&local_130);
  Write<double>::~Write((Write<double> *)&local_130);
  Read<double>::~Read((Read<double> *)&old_cav_elem_sizes.write_.shared_alloc_.direct_ptr);
  Read<int>::~Read(&local_140);
  Read<int>::Read(&local_180,(Read<int> *)&keys2old_elems.a2ab.write_.shared_alloc_.direct_ptr);
  Read<double>::Read((Read<double> *)&new_cav_elem_sizes.write_.shared_alloc_.direct_ptr,
                     (Read<double> *)&new_elem_sizes.write_.shared_alloc_.direct_ptr);
  unmap<double>((Omega_h *)&local_170,&local_180,
                (Read<signed_char> *)&new_cav_elem_sizes.write_.shared_alloc_.direct_ptr,1);
  read<double>((Omega_h *)local_160,&local_170);
  Write<double>::~Write((Write<double> *)&local_170);
  Read<double>::~Read((Read<double> *)&new_cav_elem_sizes.write_.shared_alloc_.direct_ptr);
  Read<int>::~Read(&local_180);
  Read<int>::Read(&local_1c0,(Read<int> *)&keys2new_elems.a2ab.write_.shared_alloc_.direct_ptr);
  Read<double>::Read((Read<double> *)&old_cav_elem_integrals.write_.shared_alloc_.direct_ptr,
                     (Read<double> *)&old_cav_elem_densities.write_.shared_alloc_.direct_ptr);
  unmap<double>((Omega_h *)&local_1b0,&local_1c0,
                (Read<signed_char> *)&old_cav_elem_integrals.write_.shared_alloc_.direct_ptr,1);
  read<double>((Omega_h *)local_1a0,&local_1b0);
  Write<double>::~Write((Write<double> *)&local_1b0);
  Read<double>::~Read((Read<double> *)&old_cav_elem_integrals.write_.shared_alloc_.direct_ptr);
  Read<int>::~Read(&local_1c0);
  Read<double>::Read(&local_200,(Read<double> *)local_e0);
  Read<double>::Read(&local_210,(Read<double> *)local_160);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_230,"",
             (allocator *)((long)&new_cav_elem_integrals.write_.shared_alloc_.direct_ptr + 7));
  multiply_each<double>((Omega_h *)&local_1f0,&local_200,&local_210,(string *)local_230);
  Read<double>::Read((Read<double> *)local_1e0,&local_1f0);
  Write<double>::~Write(&local_1f0);
  std::__cxx11::string::~string(local_230);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&new_cav_elem_integrals.write_.shared_alloc_.direct_ptr + 7))
  ;
  Read<double>::~Read(&local_210);
  Read<double>::~Read(&local_200);
  Read<double>::Read(&local_268,(Read<double> *)local_120);
  Read<double>::Read(&local_278,(Read<double> *)local_1a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_298,"",
             (allocator *)((long)&old_cav_integrals.write_.shared_alloc_.direct_ptr + 7));
  multiply_each<double>((Omega_h *)&local_258,&local_268,&local_278,(string *)local_298);
  Read<double>::Read((Read<double> *)local_248,&local_258);
  Write<double>::~Write(&local_258);
  std::__cxx11::string::~string(local_298);
  std::allocator<char>::~allocator
            ((allocator<char> *)((long)&old_cav_integrals.write_.shared_alloc_.direct_ptr + 7));
  Read<double>::~Read(&local_278);
  Read<double>::~Read(&local_268);
  Read<int>::Read(&local_2c0,(Read<int> *)local_a0);
  Read<double>::Read((Read<double> *)&new_cav_integrals.write_.shared_alloc_.direct_ptr,
                     (Read<double> *)local_1e0);
  fan_reduce<double>((Omega_h *)local_2b0,&local_2c0,
                     (Read<signed_char> *)&new_cav_integrals.write_.shared_alloc_.direct_ptr,
                     keys2new_elems.ab2b.write_.shared_alloc_.direct_ptr._4_4_,OMEGA_H_SUM);
  Read<double>::~Read((Read<double> *)&new_cav_integrals.write_.shared_alloc_.direct_ptr);
  Read<int>::~Read(&local_2c0);
  Read<int>::Read(&local_2f0,(Read<int> *)&keys2old_elems.ab2b.write_.shared_alloc_.direct_ptr);
  Read<double>::Read((Read<double> *)&cav_errors.write_.shared_alloc_.direct_ptr,
                     (Read<double> *)local_248);
  fan_reduce<double>((Omega_h *)local_2e0,&local_2f0,
                     (Read<signed_char> *)&cav_errors.write_.shared_alloc_.direct_ptr,
                     keys2new_elems.ab2b.write_.shared_alloc_.direct_ptr._4_4_,OMEGA_H_SUM);
  Read<double>::~Read((Read<double> *)&cav_errors.write_.shared_alloc_.direct_ptr);
  Read<int>::~Read(&local_2f0);
  Read<double>::Read(&local_320,(Read<double> *)local_2e0);
  Read<double>::Read((Read<double> *)&new_cav_sizes.write_.shared_alloc_.direct_ptr,
                     (Read<double> *)local_2b0);
  subtract_each<double>
            ((Omega_h *)local_310,&local_320,
             (Read<double> *)&new_cav_sizes.write_.shared_alloc_.direct_ptr);
  Read<double>::~Read((Read<double> *)&new_cav_sizes.write_.shared_alloc_.direct_ptr);
  Read<double>::~Read(&local_320);
  Read<int>::Read(&local_350,(Read<int> *)&keys2old_elems.ab2b.write_.shared_alloc_.direct_ptr);
  Read<double>::Read((Read<double> *)&cav_error_densities.write_.shared_alloc_.direct_ptr,
                     (Read<double> *)local_1a0);
  fan_reduce<double>((Omega_h *)local_340,&local_350,
                     (Read<signed_char> *)&cav_error_densities.write_.shared_alloc_.direct_ptr,1,
                     OMEGA_H_SUM);
  Read<double>::~Read((Read<double> *)&cav_error_densities.write_.shared_alloc_.direct_ptr);
  Read<int>::~Read(&local_350);
  Read<double>::Read(&local_380,(Read<double> *)local_310);
  Read<double>::Read((Read<double> *)&cav_elem_error_densities.write_.shared_alloc_.direct_ptr,
                     (Read<double> *)local_340);
  divide_each_maybe_zero
            ((Omega_h *)local_370,&local_380,
             (Reals *)&cav_elem_error_densities.write_.shared_alloc_.direct_ptr);
  Read<double>::~Read((Read<double> *)&cav_elem_error_densities.write_.shared_alloc_.direct_ptr);
  Read<double>::~Read(&local_380);
  Read<double>::Read(&local_3b0,(Read<double> *)local_370);
  Read<int>::Read((Read<int> *)&cav_elem_errors.write_.shared_alloc_.direct_ptr,
                  (Read<int> *)&keys2old_elems.ab2b.write_.shared_alloc_.direct_ptr);
  expand<double>((Omega_h *)local_3a0,(Read<signed_char> *)&local_3b0,
                 (LOs *)&cav_elem_errors.write_.shared_alloc_.direct_ptr,
                 keys2new_elems.ab2b.write_.shared_alloc_.direct_ptr._4_4_);
  Read<int>::~Read((Read<int> *)&cav_elem_errors.write_.shared_alloc_.direct_ptr);
  Read<double>::~Read(&local_3b0);
  Read<double>::Read(&local_3f0,(Read<double> *)local_3a0);
  Read<double>::Read(&local_400,(Read<double> *)local_1a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_420,"",&local_421);
  multiply_each<double>((Omega_h *)&local_3e0,&local_3f0,&local_400,(string *)local_420);
  Read<double>::Read((Read<double> *)local_3d0,&local_3e0);
  Write<double>::~Write(&local_3e0);
  std::__cxx11::string::~string(local_420);
  std::allocator<char>::~allocator((allocator<char> *)&local_421);
  Read<double>::~Read(&local_400);
  Read<double>::~Read(&local_3f0);
  Read<double>::Read(&local_438,(Read<double> *)local_3d0);
  Read<int>::Read(&local_448,(Read<int> *)&keys2new_elems.a2ab.write_.shared_alloc_.direct_ptr);
  Write<double>::Write(&local_458,new_elem_errors_w);
  add_into<double>((Read<signed_char> *)&local_438,&local_448,(Write<signed_char> *)&local_458,
                   keys2new_elems.ab2b.write_.shared_alloc_.direct_ptr._4_4_);
  Write<double>::~Write(&local_458);
  Read<int>::~Read(&local_448);
  Read<double>::~Read(&local_438);
  Read<double>::~Read((Read<double> *)local_3d0);
  Read<double>::~Read((Read<double> *)local_3a0);
  Read<double>::~Read((Read<double> *)local_370);
  Read<double>::~Read((Read<double> *)local_340);
  Read<double>::~Read((Read<double> *)local_310);
  Read<double>::~Read((Read<double> *)local_2e0);
  Read<double>::~Read((Read<double> *)local_2b0);
  Read<double>::~Read((Read<double> *)local_248);
  Read<double>::~Read((Read<double> *)local_1e0);
  Read<double>::~Read((Read<double> *)local_1a0);
  Read<double>::~Read((Read<double> *)local_160);
  Read<double>::~Read((Read<double> *)local_120);
  Read<double>::~Read((Read<double> *)local_e0);
  Read<double>::~Read((Read<double> *)&old_cav_elem_densities.write_.shared_alloc_.direct_ptr);
  Read<double>::~Read((Read<double> *)&new_elem_sizes.write_.shared_alloc_.direct_ptr);
  Graph::~Graph((Graph *)local_a0);
  Graph::~Graph((Graph *)&keys2old_elems.ab2b.write_.shared_alloc_.direct_ptr);
  return;
}

Assistant:

static void introduce_class_integ_error(Mesh* old_mesh, Mesh* new_mesh,
    Cavs class_cavs, Reals old_elem_densities, Reals new_elem_densities,
    Write<Real> new_elem_errors_w) {
  auto ncomps =
      divide_no_remainder(old_elem_densities.size(), old_mesh->nelems());
  auto keys2new_elems = class_cavs.keys2new_elems;
  auto keys2old_elems = class_cavs.keys2old_elems;
  auto old_elem_sizes = old_mesh->ask_sizes();
  auto new_elem_sizes = new_mesh->ask_sizes();
  auto old_cav_elem_densities =
      read(unmap(keys2old_elems.ab2b, old_elem_densities, ncomps));
  auto new_cav_elem_densities =
      read(unmap(keys2new_elems.ab2b, new_elem_densities, ncomps));
  auto old_cav_elem_sizes = read(unmap(keys2old_elems.ab2b, old_elem_sizes, 1));
  auto new_cav_elem_sizes = read(unmap(keys2new_elems.ab2b, new_elem_sizes, 1));
  Reals old_cav_elem_integrals =
      multiply_each(old_cav_elem_densities, old_cav_elem_sizes);
  Reals new_cav_elem_integrals =
      multiply_each(new_cav_elem_densities, new_cav_elem_sizes);
  auto old_cav_integrals = fan_reduce(
      keys2old_elems.a2ab, old_cav_elem_integrals, ncomps, OMEGA_H_SUM);
  auto new_cav_integrals = fan_reduce(
      keys2new_elems.a2ab, new_cav_elem_integrals, ncomps, OMEGA_H_SUM);
  auto cav_errors = subtract_each(new_cav_integrals, old_cav_integrals);
  auto new_cav_sizes =
      fan_reduce(keys2new_elems.a2ab, new_cav_elem_sizes, 1, OMEGA_H_SUM);
  auto cav_error_densities = divide_each_maybe_zero(cav_errors, new_cav_sizes);
  auto cav_elem_error_densities =
      expand(cav_error_densities, keys2new_elems.a2ab, ncomps);
  Reals cav_elem_errors =
      multiply_each(cav_elem_error_densities, new_cav_elem_sizes);
  add_into(cav_elem_errors, keys2new_elems.ab2b, new_elem_errors_w, ncomps);
}